

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

void Saig_AndDualRail(Aig_Man_t *pNew,Aig_Obj_t *pObj,Aig_Obj_t **ppData,Aig_Obj_t **ppNext)

{
  Aig_Obj_t *p0;
  Aig_Obj_t *p0_00;
  undefined8 *puVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  pAVar3 = pObj->pFanin0;
  pAVar4 = pObj->pFanin1;
  puVar5 = (undefined8 *)((ulong)pAVar3 & 0xfffffffffffffffe);
  puVar1 = (undefined8 *)((ulong)pAVar4 & 0xfffffffffffffffe);
  puVar6 = puVar5 + 5;
  if (((ulong)pAVar3 & 1) != 0) {
    puVar6 = puVar5;
  }
  p0 = (Aig_Obj_t *)*puVar6;
  pAVar3 = *(Aig_Obj_t **)((long)puVar5 + (ulong)(-((uint)pAVar3 & 1) & 0x28));
  puVar6 = puVar1 + 5;
  if (((ulong)pAVar4 & 1) != 0) {
    puVar6 = puVar1;
  }
  p0_00 = (Aig_Obj_t *)*puVar6;
  pAVar4 = *(Aig_Obj_t **)((long)puVar1 + (ulong)(-((uint)pAVar4 & 1) & 0x28));
  pAVar2 = Aig_And(pNew,p0,(Aig_Obj_t *)((ulong)pAVar3 ^ 1));
  p1 = Aig_And(pNew,p0_00,(Aig_Obj_t *)((ulong)pAVar4 ^ 1));
  pAVar2 = Aig_Or(pNew,pAVar2,p1);
  *ppData = pAVar2;
  pAVar3 = Aig_And(pNew,(Aig_Obj_t *)((ulong)p0 ^ 1),pAVar3);
  pAVar4 = Aig_And(pNew,(Aig_Obj_t *)((ulong)p0_00 ^ 1),pAVar4);
  pAVar3 = Aig_And(pNew,pAVar3,pAVar4);
  *ppNext = pAVar3;
  return;
}

Assistant:

void Saig_AndDualRail( Aig_Man_t * pNew, Aig_Obj_t * pObj, Aig_Obj_t ** ppData, Aig_Obj_t ** ppNext )
{
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    Aig_Obj_t * p0Data = Aig_ObjFaninC0(pObj)? pFanin0->pNext              : (Aig_Obj_t *)pFanin0->pData;
    Aig_Obj_t * p0Next = Aig_ObjFaninC0(pObj)? (Aig_Obj_t *)pFanin0->pData : pFanin0->pNext;
    Aig_Obj_t * p1Data = Aig_ObjFaninC1(pObj)? pFanin1->pNext              : (Aig_Obj_t *)pFanin1->pData;
    Aig_Obj_t * p1Next = Aig_ObjFaninC1(pObj)? (Aig_Obj_t *)pFanin1->pData : pFanin1->pNext;
    *ppData = Aig_Or( pNew, 
        Aig_And(pNew, p0Data, Aig_Not(p0Next)),
        Aig_And(pNew, p1Data, Aig_Not(p1Next)) );
    *ppNext = Aig_And( pNew, 
        Aig_And(pNew, Aig_Not(p0Data), p0Next),
        Aig_And(pNew, Aig_Not(p1Data), p1Next) );
}